

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::updateActivityUbChange(HighsDomain *this,HighsInt col,double oldbound,double newbound)

{
  ObjectivePropagation *this_00;
  double *pdVar1;
  int iVar2;
  HighsLp *pHVar3;
  pointer pHVar4;
  _Elt_pointer pCVar5;
  _Elt_pointer pCVar6;
  int iVar7;
  pointer piVar8;
  _Map_pointer ppCVar9;
  _Elt_pointer pCVar10;
  int iVar11;
  long lVar12;
  HighsCDouble *this_01;
  CutpoolPropagation *cutpoolprop;
  _Elt_pointer pCVar13;
  _Elt_pointer this_02;
  long lVar14;
  ConflictPoolPropagation *conflictprop;
  long lVar15;
  _Elt_pointer this_03;
  double dVar16;
  HighsCDouble activity;
  HighsCDouble HVar17;
  HighsCDouble deltamax;
  _Map_pointer local_40;
  
  pHVar3 = this->mipsolver->model_;
  piVar8 = (pHVar3->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar8[col];
  lVar14 = (long)iVar2;
  iVar7 = piVar8[(long)col + 1];
  this_00 = &this->objProp_;
  if (((this->objProp_).domain == (HighsDomain *)0x0) ||
     (ObjectivePropagation::updateActivityUbChange(this_00,col,oldbound,newbound),
     this->infeasible_ == false)) {
    for (lVar15 = 0; iVar7 - lVar14 != lVar15; lVar15 = lVar15 + 1) {
      dVar16 = (pHVar3->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar14 + lVar15];
      if (dVar16 <= 0.0) {
        deltamax = computeDelta(dVar16,oldbound,newbound,INFINITY,
                                (this->activitymininf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start +
                                (pHVar3->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar14 + lVar15]);
        HighsCDouble::operator+=
                  ((this->activitymin_).
                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14 + lVar15],&deltamax);
        if (this->recordRedundantRows_ == true) {
          iVar11 = (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14 + lVar15];
          dVar16 = (pHVar3->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar11];
          if ((-INFINITY < dVar16) &&
             (INFINITY <=
              (pHVar3->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar11])) {
            pHVar4 = (this->activitymin_).
                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                     super__Vector_impl_data._M_start;
            HVar17.lo = pHVar4[iVar11].lo;
            HVar17.hi = pHVar4[iVar11].hi;
            updateRedundantRows(this,iVar11,1,
                                (this->activitymininf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar11],HVar17,dVar16);
          }
        }
        if (deltamax.hi + deltamax.lo <= 0.0) goto LAB_002a3178;
        iVar11 = (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14 + lVar15];
        lVar12 = (long)iVar11;
        dVar16 = (pHVar3->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
        piVar8 = (this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((dVar16 < INFINITY) && (piVar8[lVar12] == 0)) {
          HVar17 = HighsCDouble::operator-
                             ((this->activitymin_).
                              super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar12,dVar16);
          dVar16 = HVar17.lo + HVar17.hi;
          pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
          piVar8 = (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (*pdVar1 <= dVar16 && dVar16 != *pdVar1) {
            this->infeasible_ = true;
            this->infeasible_pos =
                 (HighsInt)
                 ((ulong)((long)(this->domchgstack_).
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->domchgstack_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
            this->infeasible_reason =
                 (Reason)(((ulong)(uint)piVar8[lVar14 + lVar15] << 0x20) + 0xfffffffd);
            goto LAB_002a3417;
          }
          iVar11 = piVar8[lVar14 + lVar15];
          piVar8 = (this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar12 = (long)iVar11;
        }
        if (((piVar8[lVar12] < 2) &&
            ((this->propagateflags_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12] == '\0')) &&
           ((pHVar3->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] < INFINITY)) goto LAB_002a316e;
      }
      else {
        deltamax = computeDelta(dVar16,oldbound,newbound,INFINITY,
                                (this->activitymaxinf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start +
                                (pHVar3->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar14 + lVar15]);
        HighsCDouble::operator+=
                  ((this->activitymax_).
                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14 + lVar15],&deltamax);
        if (this->recordRedundantRows_ == true) {
          iVar11 = (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14 + lVar15];
          if (((pHVar3->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar11] <= -INFINITY) &&
             (dVar16 = (pHVar3->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar11], dVar16 < INFINITY)) {
            pHVar4 = (this->activitymax_).
                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                     super__Vector_impl_data._M_start;
            activity.lo = pHVar4[iVar11].lo;
            activity.hi = pHVar4[iVar11].hi;
            updateRedundantRows(this,iVar11,-1,
                                (this->activitymaxinf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar11],activity,dVar16);
          }
        }
        if (0.0 <= deltamax.hi + deltamax.lo) {
LAB_002a3178:
          updateThresholdUbChange
                    (this,col,newbound,
                     (pHVar3->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar14 + lVar15],
                     (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar14 + lVar15]);
        }
        else {
          iVar11 = (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14 + lVar15];
          lVar12 = (long)iVar11;
          dVar16 = (pHVar3->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12];
          piVar8 = (this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((-INFINITY < dVar16) && (piVar8[lVar12] == 0)) {
            HVar17 = operator-(dVar16,(this->activitymax_).
                                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar12);
            dVar16 = HVar17.lo + HVar17.hi;
            pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
            piVar8 = (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (*pdVar1 <= dVar16 && dVar16 != *pdVar1) {
              this->infeasible_ = true;
              this->infeasible_pos =
                   (HighsInt)
                   ((ulong)((long)(this->domchgstack_).
                                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->domchgstack_).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
              this->infeasible_reason =
                   (Reason)((ulong)(uint)piVar8[lVar14 + lVar15] << 0x20 | 0xfffffffc);
LAB_002a3417:
              iVar7 = (int)lVar15 + iVar2 + 1;
              goto LAB_002a31cd;
            }
            iVar11 = piVar8[lVar14 + lVar15];
            piVar8 = (this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = (long)iVar11;
          }
          if (((piVar8[lVar12] < 2) &&
              ((this->propagateflags_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12] == '\0')) &&
             (-INFINITY <
              (pHVar3->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12])) {
LAB_002a316e:
            markPropagate(this,iVar11);
          }
        }
      }
    }
    if ((this->infeasible_ & 1U) == 0) {
      this_02 = (this->cutpoolpropagation).
                super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pCVar10 = (this->cutpoolpropagation).
                super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_40 = (this->cutpoolpropagation).
                 super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      pCVar6 = (this->cutpoolpropagation).
               super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (this_02 != pCVar6) {
        CutpoolPropagation::updateActivityUbChange(this_02,col,oldbound,newbound);
        this_02 = this_02 + 1;
        if (this_02 == pCVar10) {
          this_02 = local_40[1];
          local_40 = local_40 + 1;
          pCVar10 = this_02 + 3;
        }
      }
    }
LAB_002a31cd:
    if (this->infeasible_ == true) {
      for (; iVar7 != lVar14; lVar14 = lVar14 + 1) {
        dVar16 = (pHVar3->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar14];
        if (dVar16 <= 0.0) {
          deltamax = computeDelta(dVar16,newbound,oldbound,INFINITY,
                                  (this->activitymininf_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                                  (pHVar3->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar14]);
          this_01 = (this->activitymin_).
                    super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                    super__Vector_impl_data._M_start +
                    (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar14];
        }
        else {
          deltamax = computeDelta(dVar16,newbound,oldbound,INFINITY,
                                  (this->activitymaxinf_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                                  (pHVar3->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar14]);
          this_01 = (this->activitymax_).
                    super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                    super__Vector_impl_data._M_start +
                    (pHVar3->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar14];
        }
        HighsCDouble::operator+=(this_01,&deltamax);
      }
      if (this_00->domain != (HighsDomain *)0x0) {
        ObjectivePropagation::updateActivityUbChange(this_00,col,newbound,oldbound);
      }
    }
    else {
      this_03 = (this->conflictPoolPropagation).
                super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pCVar13 = (this->conflictPoolPropagation).
                super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppCVar9 = (this->conflictPoolPropagation).
                super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      pCVar5 = (this->conflictPoolPropagation).
               super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (this_03 != pCVar5) {
        ConflictPoolPropagation::updateActivityUbChange(this_03,col,oldbound,newbound);
        this_03 = this_03 + 1;
        if (this_03 == pCVar13) {
          this_03 = ppCVar9[1];
          ppCVar9 = ppCVar9 + 1;
          pCVar13 = this_03 + 3;
        }
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::updateActivityUbChange(HighsInt col, double oldbound,
                                         double newbound) {
  auto mip = mipsolver->model_;
  HighsInt start = mip->a_matrix_.start_[col];
  HighsInt end = mip->a_matrix_.start_[col + 1];

  assert(!infeasible_);

  if (objProp_.isActive()) {
    objProp_.updateActivityUbChange(col, oldbound, newbound);
    if (infeasible_) return;
  }

  for (HighsInt i = start; i != end; ++i) {
    if (mip->a_matrix_.value_[i] > 0) {
      HighsCDouble deltamax =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, kHighsInf,
                       activitymaxinf_[mip->a_matrix_.index_[i]]);
      activitymax_[mip->a_matrix_.index_[i]] += deltamax;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpmaxact;
        computeMaxActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpmaxact);
        assert(std::fabs(double(activitymax_[mip->a_matrix_.index_[i]] -
                                tmpmaxact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymaxinf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] == -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{-1},
                            activitymaxinf_[mip->a_matrix_.index_[i]],
                            activitymax_[mip->a_matrix_.index_[i]],
                            mip->row_upper_[mip->a_matrix_.index_[i]]);

      if (deltamax >= 0) {
        updateThresholdUbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          activitymaxinf_[mip->a_matrix_.index_[i]] == 0 &&
          mip->row_lower_[mip->a_matrix_.index_[i]] -
                  activitymax_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowLower(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymaxinf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf) {
        markPropagate(mip->a_matrix_.index_[i]);
        // propagateflags_[mip->a_matrix_.index_[i]] = 1;
        // propagateinds_.push_back(mip->a_matrix_.index_[i]);
      }
    } else {
      HighsCDouble deltamin =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, kHighsInf,
                       activitymininf_[mip->a_matrix_.index_[i]]);
      activitymin_[mip->a_matrix_.index_[i]] += deltamin;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpminact;
        computeMinActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpminact);
        assert(std::fabs(double(activitymin_[mip->a_matrix_.index_[i]] -
                                tmpminact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymininf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] == kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{1},
                            activitymininf_[mip->a_matrix_.index_[i]],
                            activitymin_[mip->a_matrix_.index_[i]],
                            mip->row_lower_[mip->a_matrix_.index_[i]]);

      if (deltamin <= 0) {
        updateThresholdUbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf &&
          activitymininf_[mip->a_matrix_.index_[i]] == 0 &&
          activitymin_[mip->a_matrix_.index_[i]] -
                  mip->row_upper_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowUpper(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymininf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf) {
        markPropagate(mip->a_matrix_.index_[i]);
        // propagateflags_[mip->a_matrix_.index_[i]] = 1;
        // propagateinds_.push_back(mip->a_matrix_.index_[i]);
      }
    }
  }

  if (!infeasible_) {
    for (CutpoolPropagation& cutpoolprop : cutpoolpropagation)
      cutpoolprop.updateActivityUbChange(col, oldbound, newbound);
  } else {
    assert(infeasible_reason.type == Reason::kModelRowLower ||
           infeasible_reason.type == Reason::kModelRowUpper);
    assert(infeasible_reason.index == mip->a_matrix_.index_[end - 1]);
  }

  if (infeasible_) {
    std::swap(oldbound, newbound);
    for (HighsInt i = start; i != end; ++i) {
      if (mip->a_matrix_.value_[i] > 0) {
        activitymax_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         kHighsInf, activitymaxinf_[mip->a_matrix_.index_[i]]);
      } else {
        activitymin_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         kHighsInf, activitymininf_[mip->a_matrix_.index_[i]]);
      }
    }

    if (objProp_.isActive()) {
      objProp_.updateActivityUbChange(col, oldbound, newbound);
    }

    return;
  } else {
    for (ConflictPoolPropagation& conflictprop : conflictPoolPropagation)
      conflictprop.updateActivityUbChange(col, oldbound, newbound);
  }
}